

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_whenCallingDisabledOrIgnoredActualCallsThenTheyDontReturnPreviousCallsValues_Test
::testBody(TEST_MockReturnValueTest_whenCallingDisabledOrIgnoredActualCallsThenTheyDontReturnPreviousCallsValues_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockReturnValueTest_whenCallingDisabledOrIgnoredActualCallsThenTheyDontReturnPreviousCallsValues_Test
  *local_10;
  TEST_MockReturnValueTest_whenCallingDisabledOrIgnoredActualCallsThenTheyDontReturnPreviousCallsValues_Test
  *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_40);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))();
  (**(code **)(*plVar3 + 200))(plVar3,10);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x24])();
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"boo");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_70);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"An Ignored Call");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_90);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_a0,"");
  pMVar2 = mock(&local_a0,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[7])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((byte)((byte)iVar1 ^ 1) & 1),"CHECK","!mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2ea,pTVar5);
  SimpleString::~SimpleString(&local_a0);
  return;
}

Assistant:

TEST(MockReturnValueTest, whenCallingDisabledOrIgnoredActualCallsThenTheyDontReturnPreviousCallsValues)
{
    mock().expectOneCall("boo").ignoreOtherParameters().andReturnValue(10);
    mock().ignoreOtherCalls();
    mock().actualCall("boo");
    mock().actualCall("An Ignored Call");

    CHECK(!mock().hasReturnValue());
}